

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_job_queue_get_heap_size(ma_job_queue_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_job_queue_config *in_RSI;
  ma_job_queue_heap_layout layout;
  ma_result result;
  undefined8 local_38;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  if (in_RSI == (ma_job_queue_config *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    in_RSI->flags = 0;
    in_RSI->capacity = 0;
    local_4 = ma_job_queue_get_heap_layout
                        (in_RSI,(ma_job_queue_heap_layout *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (local_4 == MA_SUCCESS) {
      *in_RSI = local_38;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_job_queue_get_heap_size(const ma_job_queue_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_job_queue_heap_layout layout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_job_queue_get_heap_layout(pConfig, &layout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = layout.sizeInBytes;

    return MA_SUCCESS;
}